

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.h
# Opt level: O2

double __thiscall HighsImplications::VarBound::minValue(VarBound *this)

{
  double v;
  HighsCDouble HVar1;
  HighsCDouble local_10;
  
  local_10.hi = this->constant;
  local_10.lo = 0.0;
  v = 0.0;
  if (this->coef <= 0.0) {
    v = this->coef;
  }
  HVar1 = HighsCDouble::operator+(&local_10,v);
  return HVar1.hi + HVar1.lo;
}

Assistant:

double minValue() const {
      return static_cast<double>(static_cast<HighsCDouble>(constant) +
                                 std::min(coef, 0.0));
    }